

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O2

bool __thiscall
ArmParser::parsePsrTransfer
          (ArmParser *this,Parser *parser,ArmOpcodeVariables *vars,bool shortVersion)

{
  char cVar1;
  pointer pcVar2;
  uint uVar3;
  bool bVar4;
  Token *this_00;
  string *str;
  uint uVar5;
  uint uVar6;
  size_type sVar7;
  bool bVar8;
  bool bVar9;
  
  this_00 = Parser::nextToken(parser);
  if (this_00->type == Identifier) {
    str = &Token::identifierValue(this_00)->_name;
    bVar8 = false;
    bVar4 = startsWith(str,"cpsr",0);
    if (!bVar4) {
      bVar4 = startsWith(str,"spsr",0);
      bVar8 = true;
      if (!bVar4) {
        return false;
      }
    }
    (vars->PsrData).spsr = bVar8;
    if (shortVersion) {
      return str->_M_string_length == 4;
    }
    if (str->_M_string_length == 4) {
      (vars->PsrData).field = 0xf;
      return true;
    }
    if ((str->_M_dataplus)._M_p[4] == '_') {
      bVar4 = startsWith(str,"ctl",5);
      if (bVar4) {
        (vars->PsrData).field = 1;
      }
      else {
        sVar7 = 5;
        bVar4 = startsWith(str,"flg",5);
        if (!bVar4) {
          (vars->PsrData).field = 0;
          pcVar2 = (str->_M_dataplus)._M_p;
          uVar5 = 0;
          while( true ) {
            bVar8 = 3 < (int)sVar7 - 5U;
            bVar9 = sVar7 == str->_M_string_length;
            bVar4 = bVar9 || bVar8;
            if (bVar9 || bVar8) {
              return bVar4;
            }
            cVar1 = pcVar2[sVar7];
            if (cVar1 == 'c') {
              uVar6 = 1;
              uVar3 = uVar5 & 1;
            }
            else if (cVar1 == 'x') {
              uVar6 = 2;
              uVar3 = uVar5 & 2;
            }
            else if (cVar1 == 's') {
              uVar6 = 4;
              uVar3 = uVar5 & 4;
            }
            else {
              if (cVar1 != 'f') {
                return bVar4;
              }
              uVar6 = 8;
              uVar3 = uVar5 & 8;
            }
            if (uVar3 != 0) break;
            uVar5 = uVar5 | uVar6;
            (vars->PsrData).field = uVar5;
            sVar7 = sVar7 + 1;
          }
          return bVar4;
        }
        (vars->PsrData).field = 8;
      }
      return str->_M_string_length == 8;
    }
  }
  return false;
}

Assistant:

bool ArmParser::parsePsrTransfer(Parser& parser, ArmOpcodeVariables& vars, bool shortVersion)
{
	const Token& token = parser.nextToken();
	if (token.type != TokenType::Identifier)
		return false;

	const std::string &stringValue = token.identifierValue().string();
	size_t pos = 0;
	if (startsWith(stringValue,"cpsr"))
	{
		vars.PsrData.spsr = false;
		pos = 4;
	} else if (startsWith(stringValue,"spsr"))
	{
		vars.PsrData.spsr = true;
		pos = 4;
	} else {
		return false;
	}

	if (shortVersion)
		return pos == stringValue.size();

	if (pos == stringValue.size())
	{
		vars.PsrData.field = 0xF;
		return true;
	}

	if (stringValue[pos++] != '_')
		return false;

	if (startsWith(stringValue,"ctl",pos))
	{
		vars.PsrData.field = 1;
		return pos+3 == stringValue.size();
	} 
	
	if (startsWith(stringValue,"flg",pos))
	{
		vars.PsrData.field = 8;
		return pos+3 == stringValue.size();
	}
	
	vars.PsrData.field = 0;
	for (int i = 0; i < 4; i++)
	{
		if (pos == stringValue.size())
			break;

		switch(stringValue[pos++])
		{
		case 'f':
			if (vars.PsrData.field & 8)
				return false;	// can only appear once
			vars.PsrData.field |= 8;
			break;
		case 's':
			if (vars.PsrData.field & 4)
				return false;	// can only appear once
			vars.PsrData.field |= 4;
			break;
		case 'x':
			if (vars.PsrData.field & 2)
				return false;	// can only appear once
			vars.PsrData.field |= 2;
			break;
		case 'c':
			if (vars.PsrData.field & 1)
				return false;	// can only appear once
			vars.PsrData.field |= 1;
			break;
		default:
			return false;	// has to be one of those
		}
	}

	return true;
}